

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O3

void __thiscall HACD::HACD::Simplify(HACD *this)

{
  pointer plVar1;
  size_type __n;
  iterator __position;
  pointer pGVar2;
  pointer pGVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char msg [1024];
  long local_438 [129];
  
  plVar1 = (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar1) {
    (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar1;
  }
  __n = (this->m_graph).m_nV;
  this->m_nClusters = __n;
  std::vector<long,_std::allocator<long>_>::reserve(&this->m_cVertices,__n);
  pGVar2 = (this->m_graph).m_vertices.
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar3 = (this->m_graph).m_vertices.
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pGVar3 != pGVar2) {
    lVar5 = 0x268;
    lVar6 = 0;
    lVar4 = 0;
    do {
      if (*(char *)((long)pGVar2 + lVar5 + -0x1c0) == '\0') {
        if (this->m_callBack != (CallBackFunction)0x0) {
          sprintf((char *)local_438,"\t CH(%lu) \t %lu \t %lf \t %lu \t %f \t %lu\n",
                  *(undefined8 *)((long)(pGVar2->m_edges).m_data0 + lVar5 + -0x18),
                  (*(double *)((long)(pGVar2->m_edges).m_data0 + lVar5 + -0x10) * 100.0) /
                  this->m_area,lVar6,lVar4,
                  *(undefined8 *)((long)(pGVar2->m_edges).m_data0 + lVar5 + -0x28),
                  *(long *)((long)pGVar2 + lVar5 + -0x1b0) -
                  *(long *)((long)pGVar2 + lVar5 + -0x1b8) >> 3);
          (*this->m_callBack)((char *)local_438,0.0,0.0,this->m_nClusters);
          lVar4 = lVar4 + 1;
        }
        __position._M_current =
             (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_438[0] = lVar6;
        if (__position._M_current ==
            (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->m_cVertices,__position,local_438);
        }
        else {
          *__position._M_current = lVar6;
          (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pGVar2 = (this->m_graph).m_vertices.
                 super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pGVar3 = (this->m_graph).m_vertices.
                 super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x310;
    } while (lVar6 != ((long)pGVar3 - (long)pGVar2 >> 4) * 0x7d6343eb1a1f58d1);
  }
  if (this->m_callBack != (CallBackFunction)0x0) {
    sprintf((char *)local_438,"# clusters =  %lu \t C = %f\n",0,this->m_nClusters);
    (*this->m_callBack)((char *)local_438,0.0,0.0,(this->m_graph).m_nV);
  }
  return;
}

Assistant:

void HACD::Simplify()
	{
		double areaThreshold = m_area * m_smallClusterThreshold / 100.0;
		long v1 = -1;
        long v2 = -1;        
        double progressOld = -1.0;
        double progress = 0.0;
        double globalConcavity  = 0.0;     
		char msg[1024];
		double ptgStep = 1.0;
/*        while ( !m_pqueue.empty() ) 
		{

            progress = 100.0-m_graph.GetNVertices() * 100.0 / m_nTriangles;
            if (fabs(progress-progressOld) > ptgStep && m_callBack)
            {
				sprintf(msg, "%3.2f %% V = %lu \t C = %f \t \t \r", progress, static_cast<unsigned long>(m_graph.GetNVertices()), globalConcavity);
				(*m_callBack)(msg, progress, globalConcavity,  m_graph.GetNVertices());
                progressOld = progress;
				if (progress > 99.0)
				{
					ptgStep = 0.01;
				}
				else if (progress > 90.0)
				{
					ptgStep = 0.1;
				}
            }

			GraphEdgePriorityQueue currentEdge(0,0.0);
			bool done = false;
			do
			{
				done = false;
				if (m_pqueue.size() == 0)
				{
                    done = true;
                    break;
				}
                currentEdge = m_pqueue.top();
                m_pqueue.pop();
			}
			while (  m_graph.m_edges[currentEdge.m_name].m_deleted || 
					 m_graph.m_edges[currentEdge.m_name].m_error != currentEdge.m_priority);

			if (!done)
			{
				v1 = m_graph.m_edges[currentEdge.m_name].m_v1;
				v2 = m_graph.m_edges[currentEdge.m_name].m_v2;	
				bool condition1 = (m_graph.m_edges[currentEdge.m_name].m_concavity < m_concavity) && (globalConcavity < m_concavity) && (m_graph.GetNVertices() > m_nMinClusters) && (m_graph.GetNEdges() > 0);
				bool condition2 = (m_graph.m_vertices[v1].m_surf < areaThreshold || m_graph.m_vertices[v2].m_surf < areaThreshold);				
				if (condition1 || condition2)
                {
					if ((!condition1) && m_callBack)
					{
						sprintf(msg, "\n-> %lu\t%f\t%f\t%f\n", m_pqueue.size(), m_graph.m_vertices[v1].m_surf*100.0/m_area, m_graph.m_vertices[v2].m_surf*100.0/m_area, m_graph.m_edges[currentEdge.m_name].m_concavity);
						(*m_callBack)(msg, progress, globalConcavity,  m_graph.GetNVertices());
					}
					globalConcavity = std::max<double>(globalConcavity ,m_graph.m_edges[currentEdge.m_name].m_concavity);
					GraphEdge & gE = m_graph.m_edges[currentEdge.m_name];
					GraphVertex & gV1 = m_graph.m_vertices[v1];
					GraphVertex & gV2 = m_graph.m_vertices[v2];
					// update vertex info
					gV1.m_concavity     = gE.m_concavity;
	#ifdef HACD_PRECOMPUTE_CHULLS
					(*gV1.m_convexHull) = (*gE.m_convexHull);
					(gV1.m_convexHull)->SetDistPoints(0);
					// update distPoints
					std::map<long, DPoint> distPoints;
					for(size_t p = 0; p < gV1.m_distPoints.Size(); ++p) 
					{
						distPoints[gV1.m_distPoints[p].m_name] = gV1.m_distPoints[p];
					}

					std::map<long, DPoint>::iterator itDP1;	
					for(size_t p = 0; p < gV2.m_distPoints.Size(); ++p) 
					{
						const DPoint & point =  gV2.m_distPoints[p];
						itDP1 = distPoints.find(point.m_name);
						if (itDP1 == distPoints.end())
						{
							DPoint newPoint(point.m_name, 0, false, point.m_distOnly);
							distPoints.insert(std::pair<long, DPoint>(point.m_name, newPoint));
						}
						else
						{
							if ( (itDP1->second).m_distOnly && !point.m_distOnly)
							{
								(itDP1->second).m_distOnly = false;
							}
						}
					}
					gV1.m_distPoints.Clear();
					gV1.m_distPoints.Resize(distPoints.size());
					std::map<long, DPoint>::iterator itDP(distPoints.begin());
					std::map<long, DPoint>::iterator itDPEnd(distPoints.end());
					for(; itDP != itDPEnd; ++itDP) 
					{
						const DPoint & point = itDP->second;
						gV1.m_distPoints.PushBack(itDP->second);
					}
	#else
					ICHUll  * ch = gV1.m_convexHull;								  

					ch->SetDistPoints(0);											  
					// update distPoints
					std::map<long, DPoint> distPoints;
					for(size_t p = 0; p < gV1.m_distPoints.Size(); ++p) 
					{
						distPoints[gV1.m_distPoints[p].m_name] = gV1.m_distPoints[p];
					}

					std::map<long, DPoint>::iterator itDP1;	
					for(size_t p = 0; p < gV2.m_distPoints.Size(); ++p) 
					{
						const DPoint & point =  gV2.m_distPoints[p];
						itDP1 = distPoints.find(point.m_name);
						if (itDP1 == distPoints.end())
						{
							DPoint newPoint(point.m_name, 0, false, point.m_distOnly);
							distPoints.insert(std::pair<long, DPoint>(point.m_name, newPoint));
							if ( !point.m_distOnly )
							{
								ch->AddPoint(m_points[point.m_name], point.m_name);
							}
						}
						else
						{
							if ( (itDP1->second).m_distOnly && !point.m_distOnly)
							{
								(itDP1->second).m_distOnly = false;
								ch->AddPoint(m_points[point.m_name], point.m_name);
							}
						}
					}
					gV1.m_distPoints.Clear();
					gV1.m_distPoints.Resize(distPoints.size());
					std::map<long, DPoint>::iterator itDP(distPoints.begin());
					std::map<long, DPoint>::iterator itDPEnd(distPoints.end());
					for(; itDP != itDPEnd; ++itDP) 
					{
						gV1.m_distPoints.PushBack(itDP->second);
					}
					ch->SetDistPoints(0);
					while (ch->Process() == ICHUllErrorInconsistent)		// if we face problems when constructing the visual-hull. really ugly!!!!
					{
			//			if (m_callBack) (*m_callBack)("\t Problem with convex-hull construction [HACD::ComputeEdgeCost]\n", 0.0, 0.0, 0);
						ICHUll  * chOld = ch;
						ch = new ICHUll(m_heapManager);
						CircularList<TMMVertex> & verticesCH = chOld->GetMesh().m_vertices;
						size_t nV = verticesCH.GetSize();
						long ptIndex = 0;
						verticesCH.Next();
						// add noise to avoid the problem
						ptIndex = verticesCH.GetHead()->GetData().m_name;			
						ch->AddPoint(m_points[ptIndex]+ m_scale * 0.0001 * Vec3<Real>(rand() % 10 - 5, rand() % 10 - 5, rand() % 10 - 5), ptIndex);
						for(size_t v = 1; v < nV; ++v)
						{
							ptIndex = verticesCH.GetHead()->GetData().m_name;			
							ch->AddPoint(m_points[ptIndex], ptIndex);
							verticesCH.Next();
						}
						gV1.m_convexHull = ch;
						delete chOld;
					}

	#ifdef HACD_DEBUG
			if (v1 == 90 && v2==98)
			{
				const long nPoints = static_cast<long>(m_nPoints);
				std::map<long, DPoint>::iterator itDP(distPoints.begin());
				std::map<long, DPoint>::iterator itDPEnd(distPoints.end());
				for(; itDP != itDPEnd; ++itDP) 
				{	

					if (itDP->first >= nPoints)
					{
						long pt = itDP->first - nPoints;
						ch->AddPoint(m_extraDistPoints[pt], itDP->first);
					}
					else if (itDP->first >= 0)
					{
						long pt = itDP->first;
						ch->AddPoint(m_points[pt], itDP->first);
					}
					else
					{
						long pt = -itDP->first-1;
						ch->AddPoint(m_facePoints[pt], itDP->first);
						ch->AddPoint(m_facePoints[pt] + 10.0 * m_faceNormals[pt] , itDP->first);
					}
				}
				printf("-***->\n");

				ch->m_mesh.Save("debug.wrl");
			}
	#endif

	#endif
					if (m_alpha > 0.0)
					{
						std::set<unsigned long long> boudaryEdges1;
						for(size_t edV1 = 0; edV1 < gV1.m_boudaryEdges.Size(); ++edV1) 
						{
							boudaryEdges1.insert(gV1.m_boudaryEdges[edV1]);
						}
						std::set<unsigned long long> boudaryEdges2;
						for(size_t edV2 = 0; edV2 < gV2.m_boudaryEdges.Size(); ++edV2) 
						{
							boudaryEdges2.insert(gV2.m_boudaryEdges[edV2]);
						}                      
						std::set<unsigned long long> boudaryEdges;
						std::set_symmetric_difference (boudaryEdges1.begin(), 
													   boudaryEdges1.end(), 
													   boudaryEdges2.begin(), 
													   boudaryEdges2.end(),
													   std::inserter( boudaryEdges, boudaryEdges.begin() ) );
						gV1.m_boudaryEdges.Clear();
						std::set<unsigned long long>::const_iterator itBE(boudaryEdges.begin());
						std::set<unsigned long long>::const_iterator itBEEnd(boudaryEdges.end());
						for(; itBE != itBEEnd; ++itBE)
						{
							gV1.m_boudaryEdges.Insert(*itBE);
						}
					}
					gV1.m_surf += gV2.m_surf;

	#ifdef HACD_DEBUG				
					printf("v1 %i v2 %i \n", v1, v2);
	#endif
					m_graph.EdgeCollapse(v1, v2);
					long idEdge;
					for(size_t itE = 0; itE < m_graph.m_vertices[v1].m_edges.Size(); ++itE)
					{
						idEdge = m_graph.m_vertices[v1].m_edges[itE];
						ComputeEdgeCost(idEdge);
						m_pqueue.push(GraphEdgePriorityQueue(idEdge, m_graph.m_edges[idEdge].m_error));
					}
				}
			}
			else
			{
				break;
			}
		}*/
        m_cVertices.clear();
		m_nClusters = m_graph.GetNVertices();
        m_cVertices.reserve(m_nClusters);
		for (size_t p=0, v = 0; v != m_graph.m_vertices.size(); ++v) 
		{
			if (!m_graph.m_vertices[v].m_deleted)
			{
                if (m_callBack) 
                {
                    char msg[1024];
                    sprintf(msg, "\t CH(" SIZET_FMT ") \t %lu \t %lf \t " SIZET_FMT " \t %f \t " SIZET_FMT "\n", v, static_cast<unsigned long>(p), m_graph.m_vertices[v].m_concavity, m_graph.m_vertices[v].m_distPoints.Size(),  m_graph.m_vertices[v].m_surf*100.0/m_area, m_graph.m_vertices[v].m_ancestors.size());
					(*m_callBack)(msg, 0.0, 0.0, m_nClusters);
					p++;
                }
                m_cVertices.push_back(static_cast<long>(v));			
			}
		}
        if (m_callBack)
        {
			sprintf(msg, "# clusters =  %lu \t C = %f\n", static_cast<unsigned long>(m_nClusters), globalConcavity);
			(*m_callBack)(msg, progress, globalConcavity,  m_graph.GetNVertices());
        }

	}